

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipasir.cc
# Opt level: O0

int __thiscall IPAsirMiniSAT::val(IPAsirMiniSAT *this,int lit)

{
  bool bVar1;
  int in_ESI;
  IPAsirMiniSAT *in_RDI;
  lbool res;
  int in_stack_ffffffffffffffd4;
  Lit in_stack_ffffffffffffffe0;
  lbool b;
  lbool local_15;
  int local_14;
  int local_4;
  
  if ((in_RDI->nomodel & 1U) == 0) {
    local_14 = in_ESI;
    import(in_RDI,in_stack_ffffffffffffffd4);
    local_15 = Minisat::Solver::modelValue((Solver *)in_RDI,in_stack_ffffffffffffffe0);
    b.value = (uint8_t)((uint)in_stack_ffffffffffffffe0.x >> 0x18);
    Minisat::lbool::lbool((lbool *)&stack0xffffffffffffffe3,'\0');
    bVar1 = Minisat::lbool::operator==(&local_15,b);
    local_4 = local_14;
    if (!bVar1) {
      local_4 = -local_14;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int val(int lit)
    {
        if (nomodel) return 0;
        lbool res = modelValue(import(lit));
        return (res == l_True) ? lit : -lit;
    }